

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int hex_to_u64(uint8_t *in,int in_len,uint64_t *out)

{
  ulong uVar1;
  ulong *in_RDX;
  int in_ESI;
  long in_RDI;
  uint64_t ret_;
  int i;
  int local_24;
  ulong *local_20;
  int local_4;
  
  if ((in_RDI == 0) || (in_RDX == (ulong *)0x0)) {
    local_4 = 0;
  }
  else if (in_ESI % 0x10 == 0) {
    local_20 = in_RDX;
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 0x10) {
      hex_to_u8((uint8_t *)(in_RDI + local_24),0x10,(uint8_t *)local_20);
      uVar1 = *local_20;
      *local_20 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                  (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                  (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28
                  | uVar1 << 0x38;
      local_20 = local_20 + 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int hex_to_u64(const uint8_t *in, int in_len, uint64_t *out)
{
    if (in == NULL || out == NULL)
        return GML_ERROR;

    if (in_len % 16 != 0)
        return GML_ERROR;

    for (int i = 0; i < in_len; i += 16) {
        hex_to_u8(in + i, 16, (uint8_t*)out);
        if (ENDIANESS == ORDER_LITTLE_ENDIAN)
            out[0] = BSWAP8(out[0]);
        out++;
    }

    return GML_OK;
}